

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O0

MemberSyntax * __thiscall slang::parsing::Parser::parseSpecifyItem(Parser *this)

{
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> elements;
  Token keyword_00;
  SourceRange range;
  Token keyword_01;
  Token openParen_00;
  Token keyword_02;
  Token semi;
  SourceRange range_00;
  Token closeParen_00;
  PathSuffixSyntax *pPVar1;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes;
  PathDeclarationSyntax *pPVar2;
  Info *in_RDI;
  Token TVar3;
  SyntaxKind in_stack_0000003c;
  Parser *in_stack_00000040;
  AttrList in_stack_00000048;
  PathDeclarationSyntax *path_1;
  Token closeParen;
  ExpressionSyntax *pred;
  Token openParen;
  Token keyword_2;
  PathDeclarationSyntax *path;
  Token keyword_1;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> names;
  Token keyword;
  Parser *in_stack_000003d0;
  ParserBase *in_stack_fffffffffffffd88;
  Parser *in_stack_fffffffffffffd90;
  SourceLocation in_stack_fffffffffffffd98;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffda0;
  ParserBase *in_stack_fffffffffffffda8;
  SourceLocation in_stack_fffffffffffffdb0;
  Info *pIVar4;
  SourceLocation in_stack_fffffffffffffdb8;
  ExpressionSyntax *in_stack_fffffffffffffdc0;
  DiagCode code;
  undefined8 in_stack_fffffffffffffdc8;
  undefined6 in_stack_fffffffffffffdd8;
  SyntaxNode *in_stack_fffffffffffffde0;
  TokenKind in_stack_fffffffffffffe1e;
  ParserBase *in_stack_fffffffffffffe20;
  SyntaxFactory *local_1b0;
  Info *local_1a8;
  Parser *in_stack_fffffffffffffe90;
  Parser *in_stack_fffffffffffffed0;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *local_f0;
  Info *local_e8;
  TokenKind local_20;
  PathDeclarationSyntax *local_8;
  
  TVar3 = ParserBase::peek(in_stack_fffffffffffffd88);
  local_20 = TVar3.kind;
  if (local_20 == SystemIdentifier) {
    local_8 = (PathDeclarationSyntax *)parseSystemTimingCheck(in_stack_fffffffffffffed0);
  }
  else if (local_20 == OpenParenthesis) {
    local_8 = parsePathDeclaration(in_stack_000003d0);
  }
  else if (local_20 == IfKeyword) {
    ParserBase::consume((ParserBase *)in_stack_fffffffffffffdb0);
    ParserBase::expect(in_stack_fffffffffffffe20,in_stack_fffffffffffffe1e);
    attributes = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                 parseExpression(in_stack_fffffffffffffd90);
    TVar3 = ParserBase::expect(in_stack_fffffffffffffe20,in_stack_fffffffffffffe1e);
    pPVar2 = parsePathDeclaration(in_stack_000003d0);
    pIVar4 = in_RDI + 0xe;
    slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
              ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
               in_stack_fffffffffffffda0._M_extent_value,(nullptr_t)in_stack_fffffffffffffd98);
    local_1b0 = TVar3._0_8_;
    local_1a8 = TVar3.info;
    keyword_02.info = pIVar4;
    keyword_02._0_8_ = in_stack_fffffffffffffda8;
    openParen_00.info = (Info *)pPVar2;
    openParen_00._0_8_ = local_1a8;
    closeParen_00.info = in_RDI;
    closeParen_00.kind = (short)in_stack_fffffffffffffdc8;
    closeParen_00._2_1_ = (char)((ulong)in_stack_fffffffffffffdc8 >> 0x10);
    closeParen_00.numFlags.raw = (char)((ulong)in_stack_fffffffffffffdc8 >> 0x18);
    closeParen_00.rawLen = (int)((ulong)in_stack_fffffffffffffdc8 >> 0x20);
    local_8 = (PathDeclarationSyntax *)
              slang::syntax::SyntaxFactory::conditionalPathDeclaration
                        (local_1b0,attributes,keyword_02,openParen_00,in_stack_fffffffffffffdc0,
                         closeParen_00,
                         (PathDeclarationSyntax *)CONCAT26(local_20,in_stack_fffffffffffffdd8));
  }
  else if (local_20 == IfNoneKeyword) {
    ParserBase::consume((ParserBase *)in_stack_fffffffffffffdb0);
    code = SUB84((ulong)in_stack_fffffffffffffdc0 >> 0x20,0);
    parsePathDeclaration(in_stack_000003d0);
    not_null<slang::syntax::PathDescriptionSyntax_*>::operator->
              ((not_null<slang::syntax::PathDescriptionSyntax_*> *)0xa59fd1);
    pPVar1 = not_null<slang::syntax::PathSuffixSyntax_*>::operator->
                       ((not_null<slang::syntax::PathSuffixSyntax_*> *)0xa59fe0);
    if ((pPVar1->super_SyntaxNode).kind == EdgeSensitivePathSuffix) {
      Token::range((Token *)in_stack_fffffffffffffdb0);
      range_00.endLoc = in_stack_fffffffffffffdb8;
      range_00.startLoc = in_stack_fffffffffffffdb0;
      ParserBase::addDiag(in_stack_fffffffffffffda8,code,range_00);
      not_null<slang::syntax::PathDescriptionSyntax_*>::operator->
                ((not_null<slang::syntax::PathDescriptionSyntax_*> *)0xa5a04d);
      not_null<slang::syntax::PathSuffixSyntax_*>::operator->
                ((not_null<slang::syntax::PathSuffixSyntax_*> *)0xa5a05c);
      slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffffde0);
      range.endLoc = (SourceLocation)in_stack_fffffffffffffda0._M_extent_value;
      range.startLoc = in_stack_fffffffffffffd98;
      Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffffd90,range);
    }
    slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
              ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
               in_stack_fffffffffffffda0._M_extent_value,(nullptr_t)in_stack_fffffffffffffd98);
    keyword_01.info = (Info *)in_stack_fffffffffffffda0._M_extent_value;
    keyword_01._0_8_ = in_stack_fffffffffffffd98;
    local_8 = (PathDeclarationSyntax *)
              slang::syntax::SyntaxFactory::ifNonePathDeclaration
                        ((SyntaxFactory *)in_stack_fffffffffffffd90,
                         (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                         in_stack_fffffffffffffd88,keyword_01,(PathDeclarationSyntax *)0xa5a0f9);
  }
  else if (((local_20 == NoShowCancelledKeyword) ||
           ((ushort)(local_20 - PulseStyleOnDetectKeyword) < 2)) ||
          (local_20 == ShowCancelledKeyword)) {
    ParserBase::consume((ParserBase *)in_stack_fffffffffffffdb0);
    parsePathTerminals(in_stack_fffffffffffffe90);
    slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
              ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
               in_stack_fffffffffffffda0._M_extent_value,(nullptr_t)in_stack_fffffffffffffd98);
    elements._M_extent._M_extent_value = in_stack_fffffffffffffda0._M_extent_value;
    elements._M_ptr = (pointer)in_stack_fffffffffffffd98;
    slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::SeparatedSyntaxList
              ((SeparatedSyntaxList<slang::syntax::NameSyntax> *)in_stack_fffffffffffffd90,elements)
    ;
    TVar3 = ParserBase::expect(in_stack_fffffffffffffe20,in_stack_fffffffffffffe1e);
    local_f0 = TVar3._0_8_;
    local_e8 = TVar3.info;
    keyword_00.info = (Info *)in_stack_fffffffffffffda0._M_extent_value;
    keyword_00._0_8_ = in_stack_fffffffffffffd98;
    semi.info = (Info *)in_stack_fffffffffffffdb8;
    semi._0_8_ = in_stack_fffffffffffffdb0;
    local_8 = (PathDeclarationSyntax *)
              slang::syntax::SyntaxFactory::pulseStyleDeclaration
                        ((SyntaxFactory *)local_e8,local_f0,keyword_00,
                         (SeparatedSyntaxList<slang::syntax::NameSyntax> *)0xa59f70,semi);
  }
  else if (local_20 == SpecParamKeyword) {
    std::span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>::span
              ((span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> *)0xa59e2e);
    local_8 = (PathDeclarationSyntax *)
              parseSpecparam(in_stack_00000040,in_stack_00000048,in_stack_0000003c);
  }
  else {
    local_8 = (PathDeclarationSyntax *)0x0;
  }
  return &local_8->super_MemberSyntax;
}

Assistant:

MemberSyntax* Parser::parseSpecifyItem() {
    switch (peek().kind) {
        case TokenKind::SpecParamKeyword:
            return &parseSpecparam({}, SyntaxKind::SpecifyBlock);
        case TokenKind::PulseStyleOnDetectKeyword:
        case TokenKind::PulseStyleOnEventKeyword:
        case TokenKind::ShowCancelledKeyword:
        case TokenKind::NoShowCancelledKeyword: {
            auto keyword = consume();
            auto names = parsePathTerminals();
            return &factory.pulseStyleDeclaration(nullptr, keyword, names,
                                                  expect(TokenKind::Semicolon));
        }
        case TokenKind::OpenParenthesis:
            return &parsePathDeclaration();
        case TokenKind::IfNoneKeyword: {
            auto keyword = consume();
            auto& path = parsePathDeclaration();
            if (path.desc->suffix->kind == SyntaxKind::EdgeSensitivePathSuffix) {
                addDiag(diag::IfNoneEdgeSensitive, keyword.range())
                    << path.desc->suffix->sourceRange();
            }

            return &factory.ifNonePathDeclaration(nullptr, keyword, path);
        }
        case TokenKind::IfKeyword: {
            auto keyword = consume();
            auto openParen = expect(TokenKind::OpenParenthesis);
            auto& pred = parseExpression();
            auto closeParen = expect(TokenKind::CloseParenthesis);
            auto& path = parsePathDeclaration();
            return &factory.conditionalPathDeclaration(nullptr, keyword, openParen, pred,
                                                       closeParen, path);
        }
        case TokenKind::SystemIdentifier:
            return &parseSystemTimingCheck();
        default:
            // Otherwise, we got nothing and should just return null so that our caller
            // will skip and try again.
            return nullptr;
    }
}